

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall kratos::Generator::transfer_content(Generator *this,Generator *gen,string *prefix)

{
  bool bVar1;
  VarType VVar2;
  size_type sVar3;
  size_type sVar4;
  __shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  reference __in;
  type *var_name_00;
  element_type *peVar5;
  Var *new_var_00;
  element_type *peVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  ulong local_128;
  uint64_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *parameters;
  Var *new_var;
  undefined1 local_e0 [8];
  string target_name;
  type *var;
  type *var_name;
  _Self local_a8;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *__range1_2;
  shared_ptr<kratos::Expr> *expr;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<std::shared_ptr<kratos::Expr>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::allocator<std::shared_ptr<kratos::Expr>_>_>
  *__range1_1;
  shared_ptr<kratos::Stmt> local_50;
  reference local_40;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range1;
  string *prefix_local;
  Generator *gen_local;
  Generator *this_local;
  
  sVar3 = std::
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
          size(&gen->stmts_);
  sVar4 = std::
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
          size(&this->stmts_);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  reserve(&gen->stmts_,sVar3 + sVar4);
  __end1 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin(&this->stmts_);
  stmt = (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end(&this->stmts_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                     *)&stmt), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
               ::operator*(&__end1);
    std::shared_ptr<kratos::Stmt>::shared_ptr(&local_50,local_40);
    add_stmt(gen,&local_50);
    std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_set<std::shared_ptr<kratos::Expr>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::allocator<std::shared_ptr<kratos::Expr>_>_>
             ::begin(&this->exprs_);
  expr = (shared_ptr<kratos::Expr> *)
         std::
         unordered_set<std::shared_ptr<kratos::Expr>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::allocator<std::shared_ptr<kratos::Expr>_>_>
         ::end(&this->exprs_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1_1.
                             super__Node_iterator_base<std::shared_ptr<kratos::Expr>,_false>,
                            (_Node_iterator_base<std::shared_ptr<kratos::Expr>,_false> *)&expr),
        bVar1) {
    this_00 = (__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::__detail::_Node_iterator<std::shared_ptr<kratos::Expr>,_true,_false>::operator*
                        (&__end1_1);
    this_01 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Var::set_parent_generator(&this_01->super_Var,gen);
    std::
    unordered_set<std::shared_ptr<kratos::Expr>,std::hash<std::shared_ptr<kratos::Expr>>,std::equal_to<std::shared_ptr<kratos::Expr>>,std::allocator<std::shared_ptr<kratos::Expr>>>
    ::emplace<std::shared_ptr<kratos::Expr>const&>
              ((unordered_set<std::shared_ptr<kratos::Expr>,std::hash<std::shared_ptr<kratos::Expr>>,std::equal_to<std::shared_ptr<kratos::Expr>>,std::allocator<std::shared_ptr<kratos::Expr>>>
                *)&gen->exprs_,(shared_ptr<kratos::Expr> *)this_00);
    std::__detail::_Node_iterator<std::shared_ptr<kratos::Expr>,_true,_false>::operator++(&__end1_1)
    ;
  }
  __end1_2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::begin(&this->vars_);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::end(&this->vars_);
  while (bVar1 = std::operator!=(&__end1_2,&local_a8), bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
           ::operator*(&__end1_2);
    var_name_00 = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Var>>(__in);
    target_name.field_2._8_8_ =
         std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Var>>(__in);
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_name.field_2._8_8_);
    Var::set_generator(peVar5,gen);
    std::__cxx11::string::string((string *)local_e0,(string *)var_name_00);
    bVar1 = has_var(gen,var_name_00);
    if (bVar1) {
      get_unique_variable_name((string *)&new_var,this,prefix,var_name_00);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&new_var);
      std::__cxx11::string::~string((string *)&new_var);
    }
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)&peVar5->name,(string *)local_e0);
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_name.field_2._8_8_);
    VVar2 = Var::type(peVar5);
    if (VVar2 == PortIO) {
      peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)target_name.field_2._8_8_);
      new_var_00 = Generator::var(gen,peVar5,(string *)local_e0);
      peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_name.field_2._8_8_);
      (*(peVar5->super_IRNode)._vptr_IRNode[0x14])(peVar5,new_var_00);
      peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                          target_name.field_2._8_8_);
      Var::move_sink_to(peVar6,new_var_00,gen,false);
      peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                          target_name.field_2._8_8_);
      Var::move_src_to(peVar6,new_var_00,gen,false);
    }
    else {
      std::
      map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::emplace<std::__cxx11::string&,std::shared_ptr<kratos::Var>const&>
                ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)&gen->vars_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (shared_ptr<kratos::Var> *)target_name.field_2._8_8_);
    }
    if (this->parent_generator_ == gen) {
      peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                          target_name.field_2._8_8_);
      set_var_params(peVar6,&gen->params_);
    }
    else {
      peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_name.field_2._8_8_);
      (*(peVar5->super_IRNode)._vptr_IRNode[0x23])(peVar5,0);
      local_128 = 0;
      while( true ) {
        peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_name.field_2._8_8_);
        this_02 = Var::size(peVar5);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_02);
        if (sVar3 <= local_128) break;
        peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_name.field_2._8_8_);
        Var::set_size_param(peVar5,(uint32_t)local_128,(Var *)0x0);
        local_128 = local_128 + 1;
      }
    }
    std::__cxx11::string::~string((string *)local_e0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
    ::operator++(&__end1_2);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::clear
            (&this->stmts_);
  std::
  unordered_set<std::shared_ptr<kratos::Expr>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::allocator<std::shared_ptr<kratos::Expr>_>_>
  ::clear(&this->exprs_);
  return;
}

Assistant:

void Generator::transfer_content(kratos::Generator &gen, const std::string &prefix) {
    // move all stuff to the generator
    // except the variable
    gen.stmts_.reserve(gen.stmts_.size() + stmts_.size());
    for (auto const &stmt : stmts_) {
        gen.add_stmt(stmt);
    }
    for (auto const &expr : exprs_) {
        expr->set_parent_generator(&gen);
        gen.exprs_.emplace(expr);
    }

    for (auto const &[var_name, var] : vars_) {
        var->set_generator(&gen);
        std::string target_name = var_name;
        if (gen.has_var(var_name)) {
            target_name = get_unique_variable_name(prefix, var_name);
        }
        var->name = target_name;
        // maybe it's a port, in that case we need to copy its definition and create a var
        if (var->type() == VarType::PortIO) {
            auto &new_var = gen.var(*var, target_name);
            var->move_linked_to(&new_var);
            Var::move_sink_to(var.get(), &new_var, &gen, false);
            Var::move_src_to(var.get(), &new_var, &gen, false);
        } else {
            gen.vars_.emplace(target_name, var);
        }
        if (parent_generator_ == &gen) {
            const auto &parameters = gen.params_;
            set_var_params(var.get(), parameters);
        } else {
            // unlink parameters
            var->set_width_param(nullptr);
            for (uint64_t i = 0; i < var->size().size(); i++) {
                var->set_size_param(i, nullptr);
            }
        }
    }

    stmts_.clear();
    exprs_.clear();
}